

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printjava.cc
# Opt level: O0

void __thiscall PrintJavaCapability::PrintJavaCapability(PrintJavaCapability *this)

{
  PrintJavaCapability *this_local;
  
  PrintLanguageCapability::PrintLanguageCapability(&this->super_PrintLanguageCapability);
  (this->super_PrintLanguageCapability).super_CapabilityPoint._vptr_CapabilityPoint =
       (_func_int **)&PTR__PrintJavaCapability_00856620;
  std::__cxx11::string::operator=
            ((string *)&(this->super_PrintLanguageCapability).name,"java-language");
  (this->super_PrintLanguageCapability).isdefault = false;
  return;
}

Assistant:

PrintJavaCapability::PrintJavaCapability(void)

{
  name = "java-language";
  isdefault = false;
}